

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O3

bool CoreML::Specification::operator==(TreeEnsembleClassifier *a,TreeEnsembleClassifier *b)

{
  uint32_t uVar1;
  bool bVar2;
  undefined1 *b_00;
  undefined1 *a_00;
  
  a_00 = (undefined1 *)a->treeensemble_;
  if ((TreeEnsembleParameters *)a_00 == (TreeEnsembleParameters *)0x0) {
    a_00 = _TreeEnsembleParameters_default_instance_;
  }
  b_00 = (undefined1 *)b->treeensemble_;
  if ((TreeEnsembleParameters *)b_00 == (TreeEnsembleParameters *)0x0) {
    b_00 = _TreeEnsembleParameters_default_instance_;
  }
  bVar2 = operator==((TreeEnsembleParameters *)a_00,(TreeEnsembleParameters *)b_00);
  if (((bVar2) && (a->postevaluationtransform_ == b->postevaluationtransform_)) &&
     (uVar1 = a->_oneof_case_[0], uVar1 == b->_oneof_case_[0])) {
    if (uVar1 == 100) {
      bVar2 = vectorsEqual<CoreML::Specification::StringVector>
                        ((a->ClassLabels_).stringclasslabels_,(b->ClassLabels_).stringclasslabels_);
      return bVar2;
    }
    bVar2 = true;
    if (uVar1 == 0x65) {
      bVar2 = vectorsEqual<CoreML::Specification::Int64Vector>
                        ((a->ClassLabels_).int64classlabels_,(b->ClassLabels_).int64classlabels_);
      return bVar2;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator==(const TreeEnsembleClassifier& a,
                        const TreeEnsembleClassifier& b) {
            if (a.treeensemble() != b.treeensemble()) {
                return false;
            }
            if (a.postevaluationtransform() != b.postevaluationtransform()) {
                return false;
            }
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case TreeEnsembleClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case TreeEnsembleClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case TreeEnsembleClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
            return true;
        }